

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_add.c
# Opt level: O0

int linkedlist_add(s_linkedlist *linked_list,uint index,void *element)

{
  s_linkedlist_node *__s;
  s_linkedlist_node *node_to_insert;
  s_linkedlist_node *node;
  void *element_local;
  uint index_local;
  s_linkedlist *linked_list_local;
  
  node_to_insert = linked_list->head;
  element_local._4_4_ = index;
  if (index == 0) {
    linked_list_local._4_4_ = linkedlist_add_front(linked_list,element);
  }
  else {
    for (; node_to_insert != (s_linkedlist_node *)0x0; node_to_insert = node_to_insert->next) {
      if (element_local._4_4_ == 0) {
        __s = (s_linkedlist_node *)malloc(0x18);
        if (__s == (s_linkedlist_node *)0x0) {
          return -1;
        }
        memset(__s,0,0x18);
        __s->element = element;
        __s->previous = node_to_insert->previous;
        __s->next = node_to_insert;
        if (node_to_insert->previous != (s_linkedlist_node *)0x0) {
          node_to_insert->previous->next = __s;
        }
        node_to_insert->previous = __s;
        linked_list->size = linked_list->size + 1;
        return 0;
      }
      element_local._4_4_ = element_local._4_4_ - 1;
    }
    linked_list_local._4_4_ = -1;
  }
  return linked_list_local._4_4_;
}

Assistant:

int linkedlist_add(s_linkedlist *linked_list, unsigned int index, void *element) {
    s_linkedlist_node *node = linked_list->head;

    if (index == 0) {
        return linkedlist_add_front(linked_list, element);
    } else {
        while (node != NULL) {
            if (index == 0) {
                s_linkedlist_node *node_to_insert = malloc(sizeof(s_linkedlist_node));
                if (node_to_insert == NULL) {
                    return (LINKEDLIST_RETVAL_FAILURE);
                }

                memset(node_to_insert, 0, sizeof(s_linkedlist_node));

                node_to_insert->element  = element;
                node_to_insert->previous = node->previous;
                node_to_insert->next     = node;
                if (node->previous != NULL) {
                    node->previous->next = node_to_insert;
                }
                node->previous           = node_to_insert;

                linked_list->size += 1;
                return (LINKEDLIST_RETVAL_SUCCESS);
            }

            index -= 1;
            node = node->next;
        }
    }

    return (LINKEDLIST_RETVAL_FAILURE);
}